

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QString>::emplace<QString>
          (QMovableArrayOps<QString> *this,qsizetype i,QString *args)

{
  qsizetype *pqVar1;
  QString **ppQVar2;
  Data *pDVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  QString *pQVar6;
  qsizetype qVar7;
  QTypedArrayData<char16_t> *__old_val;
  char16_t *__old_val_1;
  long in_FS_OFFSET;
  bool bVar8;
  Inserter local_80;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.size == i) {
      qVar7 = QArrayDataPointer<QString>::freeSpaceAtEnd((QArrayDataPointer<QString> *)this);
      if (qVar7 == 0) goto LAB_00264add;
      QArrayDataPointer<char16_t>::QArrayDataPointer
                (&(this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr
                  [(this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.size].d,
                 &args->d);
LAB_00264c18:
      pqVar1 = &(this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.size;
      *pqVar1 = *pqVar1 + 1;
      goto LAB_00264bd3;
    }
LAB_00264add:
    if (i == 0) {
      qVar7 = QArrayDataPointer<QString>::freeSpaceAtBegin((QArrayDataPointer<QString> *)this);
      if (qVar7 != 0) {
        QArrayDataPointer<char16_t>::QArrayDataPointer
                  (&(this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr[-1]
                    .d,&args->d);
        ppQVar2 = &(this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr;
        *ppQVar2 = *ppQVar2 + -1;
        goto LAB_00264c18;
      }
    }
  }
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pDVar4 = (args->d).d;
  pcVar5 = (args->d).ptr;
  (args->d).d = (Data *)0x0;
  (args->d).ptr = (char16_t *)0x0;
  qVar7 = (args->d).size;
  (args->d).size = 0;
  bVar8 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.size != 0;
  QArrayDataPointer<QString>::detachAndGrow
            ((QArrayDataPointer<QString> *)this,(uint)(i == 0 && bVar8),1,(QString **)0x0,
             (QArrayDataPointer<QString> *)0x0);
  if (i == 0 && bVar8) {
    pQVar6 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr;
    pQVar6[-1].d.d = pDVar4;
    pQVar6[-1].d.ptr = pcVar5;
    pQVar6[-1].d.size = qVar7;
    (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr = pQVar6 + -1;
    pqVar1 = &(this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.size;
    *pqVar1 = *pqVar1 + 1;
  }
  else {
    Inserter::Inserter(&local_80,(QArrayDataPointer<QString> *)this,i,1);
    ((local_80.displaceFrom)->d).d = pDVar4;
    ((local_80.displaceFrom)->d).ptr = pcVar5;
    ((local_80.displaceFrom)->d).size = qVar7;
    local_80.displaceFrom = local_80.displaceFrom + 1;
    (local_80.data)->size = (local_80.data)->size + local_80.nInserts;
  }
  local_58.size = 0;
  local_58.ptr = (char16_t *)0x0;
  local_58.d = (Data *)0x0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
LAB_00264bd3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }